

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_int_&> __thiscall
kj::Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>>::
find<0ul,unsigned_int>
          (Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>> *this,
          StringPtr *params)

{
  StringPtr *pSVar1;
  char *pcVar2;
  char *pcVar3;
  uint in_EDX;
  uint *puVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  StringPtr *pSVar9;
  
  pSVar1 = (StringPtr *)params[3].content.size_;
  if (pSVar1 == (StringPtr *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar2 = params[3].content.ptr;
    uVar6 = in_EDX * 0x8000 + ~in_EDX;
    uVar6 = (uVar6 >> 0xc ^ uVar6) * 5;
    uVar7 = (uVar6 >> 4 ^ uVar6) * 0x809;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    pcVar8 = (char *)(ulong)((int)pSVar1 - 1U & uVar7);
    uVar6 = *(uint *)(pcVar2 + (long)pcVar8 * 8 + 4);
    if (uVar6 == 0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar3 = (params->content).ptr;
      puVar4 = (uint *)(pcVar2 + (long)pcVar8 * 8);
      pcVar5 = (char *)0x0;
      do {
        if (((uVar6 != 1) && (*puVar4 == uVar7)) &&
           (*(uint *)(pcVar3 + (ulong)(uVar6 - 2) * 4) == in_EDX)) {
          pcVar5 = pcVar3 + (ulong)(uVar6 - 2) * 4;
          break;
        }
        pSVar9 = (StringPtr *)(pcVar8 + 1);
        pcVar8 = (char *)((ulong)pSVar9 & 0xffffffff);
        if (pSVar9 == pSVar1) {
          pcVar8 = pcVar5;
        }
        puVar4 = (uint *)(pcVar2 + (long)pcVar8 * 8);
        uVar6 = puVar4[1];
      } while (uVar6 != 0);
    }
  }
  *(char **)this = pcVar5;
  return (Maybe<unsigned_int_&>)pSVar1;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}